

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_dynamic_suite::dynamic_push_back_iterator(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  ulong uVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_99;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  circular_view<int,18446744073709551615ul> *local_68;
  size_type sStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_48;
  long local_40;
  long local_38;
  ulong local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_48 = &local_28;
  local_28 = 0;
  uStack_20 = 0;
  local_40 = 4;
  local_38 = 0;
  local_30 = 4;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,(allocator_type *)&local_58);
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_48,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  local_58 = 0x160000000b;
  uStack_50 = 0x2c00000021;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_00,&local_99);
  uVar1 = local_40 * 2;
  if ((uVar1 & local_40 * 2 - 1U) == 0) {
    uVar2 = local_30 - local_38 & uVar1 - 1;
    sStack_60 = uVar1 - 1 & local_30;
  }
  else {
    uVar2 = (local_30 - local_38) % uVar1;
    sStack_60 = local_30 % uVar1;
  }
  first_end.current = sStack_60;
  first_end.parent = (view_pointer)&local_48;
  first_begin.current = uVar2;
  first_begin.parent = (view_pointer)&local_48;
  local_68 = (circular_view<int,18446744073709551615ul> *)&local_48;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x160,"void api_dynamic_suite::dynamic_push_back_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dynamic_push_back_iterator()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 11, 22, 33, 44 };
    span.push_back(input.begin(), input.end());
    {
        std::vector<int> expect = {11, 22, 33, 44};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}